

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymTable.cpp
# Opt level: O3

void __thiscall SymTable::Print(SymTable *this)

{
  int iVar1;
  ostream *poVar2;
  _Base_ptr p_Var3;
  _Rb_tree_header *p_Var4;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sym>
  item;
  char local_a1;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sym>
  local_a0;
  
  p_Var3 = (this->symtable)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var4 = &(this->symtable)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var3 != p_Var4) {
    do {
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sym>
      ::pair(&local_a0,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sym>
              *)(p_Var3 + 1));
      iVar1 = std::__cxx11::string::compare((char *)&local_a0.second.Type);
      if (iVar1 == 0) {
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,local_a0.second.Name._M_dataplus._M_p,
                            local_a0.second.Name._M_string_length);
        local_a1 = ' ';
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_a1,1);
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar2,local_a0.second.Type._M_dataplus._M_p,
                            local_a0.second.Type._M_string_length);
        local_a1 = ' ';
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_a1,1);
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_a0.second.iValue);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      }
      else {
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,local_a0.second.Name._M_dataplus._M_p,
                            local_a0.second.Name._M_string_length);
        local_a1 = ' ';
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_a1,1);
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar2,local_a0.second.Type._M_dataplus._M_p,
                            local_a0.second.Type._M_string_length);
        local_a1 = ' ';
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_a1,1);
        poVar2 = std::ostream::_M_insert<double>(local_a0.second.dValue);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      }
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0.second.Type._M_dataplus._M_p != &local_a0.second.Type.field_2) {
        operator_delete(local_a0.second.Type._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0.second.Name._M_dataplus._M_p != &local_a0.second.Name.field_2) {
        operator_delete(local_a0.second.Name._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0.first._M_dataplus._M_p != &local_a0.first.field_2) {
        operator_delete(local_a0.first._M_dataplus._M_p);
      }
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var4);
  }
  return;
}

Assistant:

void SymTable::Print() {
    for(auto item : symtable){
        if(item.second.Type=="int")
            std::cout<<item.second.Name<<' '<<item.second.Type<<' '<<item.second.iValue<<std::endl;
        else
            std::cout<<item.second.Name<<' '<<item.second.Type<<' '<<item.second.dValue<<std::endl;
    }
}